

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# any.hpp
# Opt level: O2

big_type * linb::any_cast<big_type>(any *operand)

{
  bool bVar1;
  
  if ((operand != (any *)0x0) &&
     (bVar1 = any::is_typed(operand,(type_info *)&big_type::typeinfo), bVar1)) {
    return (big_type *)(operand->storage).dynamic;
  }
  return (big_type *)0x0;
}

Assistant:

inline ValueType* any_cast(any* operand) noexcept
{
    using T = typename std::decay<ValueType>::type;

#ifndef ANY_IMPL_NO_RTTI
    if (operand && operand->is_typed(typeid(T)))
#else
    if (operand && operand->vtable == any::vtable_for_type<T>())
#endif
        return operand->cast<ValueType>();
    else
        return nullptr;
}

inline void swap(any& lhs, any& rhs) noexcept
{
    lhs.swap(rhs);
}

template <typename T, typename... Args>
any make_any(Args&&... args)
{
    return any(in_place_type_t<T>{}, std::forward<Args>(args)...);
}

template <typename T, typename U, typename... Args>
any make_any(std::initializer_list<U> il, Args&&... args)
{
    return any(in_place_type_t<T>{}, il, std::forward<Args>(args)...);
}
}